

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int NextProtoSelectCallback(SSL *ssl,uint8_t **out,uint8_t *outlen,uint8_t *in,uint inlen,void *arg)

{
  TestConfig *pTVar1;
  
  pTVar1 = GetTestConfig(ssl);
  *out = (uint8_t *)(pTVar1->select_next_proto)._M_dataplus._M_p;
  *outlen = (uint8_t)(pTVar1->select_next_proto)._M_string_length;
  return 0;
}

Assistant:

static int NextProtoSelectCallback(SSL *ssl, uint8_t **out, uint8_t *outlen,
                                   const uint8_t *in, unsigned inlen,
                                   void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  *out = (uint8_t *)config->select_next_proto.data();
  *outlen = config->select_next_proto.size();
  return SSL_TLSEXT_ERR_OK;
}